

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

wchar_t * pm_slashskip_w(wchar_t *s)

{
  bool bVar1;
  wchar_t *local_10;
  wchar_t *s_local;
  
  local_10 = s;
  while( true ) {
    bVar1 = true;
    if ((*local_10 != L'/') &&
       (((*local_10 != L'.' || (bVar1 = true, local_10[1] != L'/')) &&
        (bVar1 = false, *local_10 == L'.')))) {
      bVar1 = local_10[1] == L'\0';
    }
    if (!bVar1) break;
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

static const wchar_t *
pm_slashskip_w(const wchar_t *s) {
	while ((*s == L'/')
	    || (s[0] == L'.' && s[1] == L'/')
	    || (s[0] == L'.' && s[1] == L'\0'))
		++s;
	return (s);
}